

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O0

void HeapProfileTable::CleanupOldProfiles(char *prefix)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *fname;
  int i;
  int prefix_length;
  int r;
  glob_t g;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string pattern;
  char *prefix_local;
  
  if ((FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_cleanup_old_heap_profiles
      & 1) != 0) {
    pattern.field_2._8_8_ = prefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,prefix,&local_71);
    std::operator+(&local_50,&local_70,".*");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   &local_50,".heap");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = glob(pcVar2,1,(__errfunc *)0x0,(glob_t *)&prefix_length);
    if ((iVar1 == 0) || (iVar1 == 3)) {
      sVar3 = strlen((char *)pattern.field_2._8_8_);
      for (fname._4_4_ = 0; (ulong)(long)fname._4_4_ < _prefix_length; fname._4_4_ = fname._4_4_ + 1
          ) {
        pcVar2 = *(char **)(g.gl_pathc + (long)fname._4_4_ * 8);
        sVar4 = strlen(pcVar2);
        if (((ulong)(long)(int)sVar3 <= sVar4) &&
           (iVar1 = memcmp(pcVar2,(void *)pattern.field_2._8_8_,(long)(int)sVar3), iVar1 == 0)) {
          RAW_VLOG(1,"Removing old heap profile %s",pcVar2);
          unlink(pcVar2);
        }
      }
    }
    globfree((glob_t *)&prefix_length);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void HeapProfileTable::CleanupOldProfiles(const char* prefix) {
  if (!FLAGS_cleanup_old_heap_profiles)
    return;
  std::string pattern = std::string(prefix) + ".*" + kFileExt;
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), GLOB_ERR, nullptr, &g);
  if (r == 0 || r == GLOB_NOMATCH) {
    const int prefix_length = strlen(prefix);
    for (int i = 0; i < g.gl_pathc; i++) {
      const char* fname = g.gl_pathv[i];
      if ((strlen(fname) >= prefix_length) &&
          (memcmp(fname, prefix, prefix_length) == 0)) {
        RAW_VLOG(1, "Removing old heap profile %s", fname);
        unlink(fname);
      }
    }
  }
  globfree(&g);
#else   /* HAVE_GLOB_H */
  RAW_LOG(WARNING, "Unable to remove old heap profiles (can't run glob())");
#endif
}